

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

double * __thiscall amrex::BaseFab<double>::dataPtr(BaseFab<double> *this,int n)

{
  long lVar1;
  Long LVar2;
  int in_ESI;
  Box *in_RDI;
  double *local_8;
  
  if (*(long *)((in_RDI->bigend).vect + 1) == 0) {
    local_8 = (double *)0x0;
  }
  else {
    lVar1 = *(long *)((in_RDI->bigend).vect + 1);
    LVar2 = Box::numPts(in_RDI);
    local_8 = (double *)(lVar1 + in_ESI * LVar2 * 8);
  }
  return local_8;
}

Assistant:

T* dataPtr (int n = 0) noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }